

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::DescriptorTableName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FileDescriptor *file,Options *options)

{
  allocator local_41;
  string local_40;
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  
  local_20 = (Options *)file;
  options_local = (Options *)this;
  file_local = (FileDescriptor *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"descriptor_table",&local_41);
  UniqueName(__return_storage_ptr__,&local_40,(FileDescriptor *)options_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorTableName(const FileDescriptor* file,
                                const Options& options) {
  return UniqueName("descriptor_table", file, options);
}